

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O3

bool __thiscall Sector::operator==(Sector *this,Sector *sector)

{
  int iVar1;
  pointer pDVar2;
  void *__s1;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  bVar3 = Header::operator!=(&sector->header,&this->header);
  if (!bVar3) {
    pDVar2 = (sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pDVar2;
    if ((uVar6 == 0) &&
       ((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_start)) {
LAB_0016b74d:
      uVar7 = 1;
      goto LAB_0016b713;
    }
    if (((int)(uVar6 >> 3) * -0x55555555 != 0) &&
       ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0)) {
      iVar5 = *(int *)((long)&(pDVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8);
      iVar1 = *(int *)&(pDVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
      iVar4 = Header::sector_size(&sector->header);
      uVar7 = 0;
      if (iVar5 - iVar1 < iVar4) goto LAB_0016b713;
      pDVar2 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pDVar2) >> 3) * -0x55555555
          != 0) {
        uVar7 = *(int *)((long)&(pDVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8) -
                *(int *)&(pDVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
      }
      iVar5 = Header::sector_size(&this->header);
      if (iVar5 <= (int)uVar7) {
        __s1 = *(void **)&(((this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                            super__Vector_impl_data._M_start)->
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
        iVar5 = Header::sector_size(&this->header);
        if (iVar5 != 0) {
          iVar5 = bcmp(__s1,*(void **)&(((sector->m_data).
                                         super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                                         super__Vector_impl_data._M_start)->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl,(long)iVar5);
          uVar7 = (uint)(iVar5 == 0);
          goto LAB_0016b713;
        }
        goto LAB_0016b74d;
      }
    }
  }
  uVar7 = 0;
LAB_0016b713:
  return SUB41(uVar7,0);
}

Assistant:

bool Sector::operator== (const Sector& sector) const
{
    // Headers must match
    if (sector.header != header)
        return false;

    // If neither has data it's a match
    if (sector.m_data.size() == 0 && m_data.size() == 0)
        return true;

    // Both sectors must have some data
    if (sector.copies() == 0 || copies() == 0)
        return false;

    // Both first sectors must have at least the natural size to compare
    if (sector.data_size() < sector.size() || data_size() < size())
        return false;

    // The natural data contents must match
    return std::equal(data_copy().begin(), data_copy().begin() + size(), sector.data_copy().begin());
}